

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtbc(fitsfile *fptr,LONGLONG *totalwidth,int *status)

{
  int iVar1;
  long lVar2;
  ushort **ppuVar3;
  long lVar4;
  int *in_RDX;
  long *in_RSI;
  int *in_RDI;
  char *cptr;
  char message [81];
  fitsfile *in_stack_00000068;
  tcolumn *colptr;
  LONGLONG nbytes;
  int ii;
  int tfields;
  char *local_a0;
  char local_98 [88];
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_00000068,stack0x00000060), 0 < iVar1)) {
        return *in_RDX;
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
    }
    iVar1 = *(int *)(*(long *)(in_RDI + 2) + 0x3b0);
    lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0);
    *in_RSI = 0;
    for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
      *(long *)(lVar4 + 0x48) = *in_RSI;
      if (*(int *)(lVar4 + 0x50) == 0x10) {
        lVar2 = *(long *)(lVar4 + 0x58);
      }
      else if (*(int *)(lVar4 + 0x50) == 1) {
        lVar2 = (*(long *)(lVar4 + 0x58) + 7) / 8;
      }
      else if (*(int *)(lVar4 + 0x50) < 1) {
        local_a0 = (char *)(lVar4 + 0x8c);
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_a0] & 0x800) != 0) {
          local_a0 = local_a0 + 1;
        }
        if (*local_a0 == 'P') {
          lVar2 = *(long *)(lVar4 + 0x58) << 3;
        }
        else {
          if (*local_a0 != 'Q') {
            snprintf(local_98,0x51,"unknown binary table column type: %s",lVar4 + 0x8c);
            ffpmsg((char *)0x16f9dc);
            *in_RDX = 0x105;
            return *in_RDX;
          }
          lVar2 = *(long *)(lVar4 + 0x58) << 4;
        }
      }
      else {
        lVar2 = *(long *)(lVar4 + 0x58) * (long)(*(int *)(lVar4 + 0x50) / 10);
      }
      *in_RSI = *in_RSI + lVar2;
      lVar4 = lVar4 + 0xa0;
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgtbc(fitsfile *fptr,    /* I - FITS file pointer          */
           LONGLONG *totalwidth,  /* O - total width of a table row */
           int *status)       /* IO - error status              */
{
/*
  calculate the starting byte offset of each column of a binary table.
  Use the values of the datatype code and repeat counts in the
  column structure. Return the total length of a row, in bytes.
*/
    int tfields, ii;
    LONGLONG nbytes;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *cptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    tfields = (fptr->Fptr)->tfield;
    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */

    *totalwidth = 0;

    for (ii = 0; ii < tfields; ii++, colptr++)
    {
        colptr->tbcol = *totalwidth;  /* byte offset in row to this column */

        if (colptr->tdatatype == TSTRING)
        {
            nbytes =  colptr->trepeat;   /* one byte per char */
        }
        else if (colptr->tdatatype == TBIT)
        {
            nbytes = ( colptr->trepeat + 7) / 8;
        }
        else if (colptr->tdatatype > 0)
        {
            nbytes =  colptr->trepeat * (colptr->tdatatype / 10);
        }
        else  {
	
	  cptr = colptr->tform;
	  while (isdigit(*cptr)) cptr++;
	
	  if (*cptr == 'P')  
	   /* this is a 'P' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 8;
	  else if (*cptr == 'Q') 
	   /* this is a 'Q' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 16;

	  else {
		snprintf(message,FLEN_ERRMSG,
		"unknown binary table column type: %s", colptr->tform);
		ffpmsg(message);
		*status = BAD_TFORM;
		return(*status);
	  }
 	}

       *totalwidth = *totalwidth + nbytes;
    }
    return(*status);
}